

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O1

void HRSS_poly3_invert(poly3 *out,poly3 *in)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  size_t i;
  long lVar8;
  long lVar9;
  uint uVar10;
  poly2 *ppVar11;
  crypto_word_t *pcVar12;
  poly3 *ppVar13;
  poly2 *ppVar14;
  crypto_word_t cVar15;
  byte bVar16;
  int iVar17;
  ulong uVar18;
  uint uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  undefined1 auVar31 [16];
  vec_t v_a [6];
  vec_t v_s [6];
  vec_t f_a [6];
  vec_t f_s [6];
  vec_t r_a [6];
  vec_t r_s [6];
  vec_t g_a [6];
  vec_t g_s [6];
  poly3 in_reversed;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined4 local_318;
  uint auStack_314 [23];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 local_e8 [16];
  poly2 local_d0;
  poly2 local_78;
  undefined1 auVar19 [16];
  
  bVar16 = 0;
  local_378 = (undefined1  [16])0x0;
  local_368 = (undefined1  [16])0x0;
  local_358 = (undefined1  [16])0x0;
  local_348 = (undefined1  [16])0x0;
  local_338 = (undefined1  [16])0x0;
  local_328 = (undefined1  [16])0x0;
  local_3d8 = (undefined1  [16])0x0;
  local_3c8 = (undefined1  [16])0x0;
  local_3b8 = (undefined1  [16])0x0;
  local_3a8 = (undefined1  [16])0x0;
  local_398 = (undefined1  [16])0x0;
  local_388 = (undefined1  [16])0x0;
  local_1f8 = (undefined1  [16])0x0;
  local_1e8 = (undefined1  [16])0x0;
  local_1d8 = (undefined1  [16])0x0;
  local_1c8 = (undefined1  [16])0x0;
  local_1b8 = (undefined1  [16])0x0;
  local_1a8 = (undefined1  [16])0x0;
  local_208 = (undefined1  [16])0x0;
  local_218 = (undefined1  [16])0x0;
  local_228 = (undefined1  [16])0x0;
  local_238 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  local_258 = ZEXT416(1);
  local_268 = (undefined1  [16])0x0;
  local_278 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_2a8 = (undefined1  [16])0x0;
  local_2b8 = (undefined1  [16])0x0;
  auStack_314[0xf] = 0xffffffff;
  auStack_314[0x10] = 0xffffffff;
  auStack_314[0x11] = 0xffffffff;
  auStack_314[0x12] = 0xffffffff;
  auStack_314[0xb] = 0xffffffff;
  auStack_314[0xc] = 0xffffffff;
  auStack_314[0xd] = 0xffffffff;
  auStack_314[0xe] = 0xffffffff;
  auStack_314[7] = 0xffffffff;
  auStack_314[8] = 0xffffffff;
  auStack_314[9] = 0xffffffff;
  auStack_314[10] = 0xffffffff;
  auStack_314[3] = 0xffffffff;
  auStack_314[4] = 0xffffffff;
  auStack_314[5] = 0xffffffff;
  auStack_314[6] = 0xffffffff;
  local_318._0_2_ = 0xffff;
  local_318._2_2_ = 0xffff;
  auStack_314[0] = 0xffffffff;
  auStack_314[1] = 0xffffffff;
  auStack_314[2] = 0xffffffff;
  auStack_314[0x13] = 0xffffffff;
  auStack_314[0x14] = 0x1fffffff;
  auStack_314[0x15] = 0;
  auStack_314[0x16] = 0;
  poly2_reverse_700(&local_78,&in->a);
  poly2_reverse_700(&local_d0,&in->s);
  local_e8 = (undefined1  [16])0x0;
  ppVar11 = &local_d0;
  pcVar12 = &local_138;
  for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
    *pcVar12 = ppVar11->v[0];
    ppVar11 = (poly2 *)((long)ppVar11 + ((ulong)bVar16 * -2 + 1) * 8);
    pcVar12 = pcVar12 + (ulong)bVar16 * -2 + 1;
  }
  local_148 = (undefined1  [16])0x0;
  ppVar11 = &local_78;
  pcVar12 = &local_198;
  for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
    *pcVar12 = ppVar11->v[0];
    ppVar11 = (poly2 *)((long)ppVar11 + ((ulong)bVar16 * -2 + 1) * 8);
    pcVar12 = pcVar12 + (ulong)bVar16 * -2 + 1;
  }
  uVar10 = 1;
  lVar8 = 0;
  do {
    lVar9 = 0;
    uVar18 = 0;
    uVar21 = 0;
    do {
      uVar2 = *(ulong *)(local_378 + lVar9);
      uVar3 = *(ulong *)(local_378 + lVar9 + 8);
      *(ulong *)(local_378 + lVar9) = uVar2 * 2 | uVar21;
      *(ulong *)(local_378 + lVar9 + 8) = uVar2 >> 0x3f | uVar3 * 2;
      uVar21 = *(ulong *)(local_3d8 + lVar9);
      uVar2 = *(ulong *)(local_3d8 + lVar9 + 8);
      *(ulong *)(local_3d8 + lVar9) = uVar21 * 2 | uVar18;
      *(ulong *)(local_3d8 + lVar9 + 8) = uVar21 >> 0x3f | uVar2 * 2;
      lVar9 = lVar9 + 0x10;
      uVar18 = uVar2 >> 0x3f;
      uVar21 = uVar3 >> 0x3f;
    } while (lVar9 != 0x60);
    uVar20 = (uint)((long)((0 < (int)uVar10 & local_198) << 0x3f) >> 0x3f);
    iVar17 = (int)((long)((local_198 &
                          CONCAT44(auStack_314[0],CONCAT22(local_318._2_2_,(ushort)local_318))) <<
                         0x3f) >> 0x3f);
    auVar19._0_8_ = CONCAT44(iVar17,iVar17);
    auVar19._8_4_ = iVar17;
    auVar19._12_4_ = iVar17;
    auVar22._4_4_ = (int)((long)(((local_138 ^ local_2b8._0_8_) & auVar19._0_8_) << 0x3f) >> 0x3f);
    lVar9 = 0;
    do {
      uVar4 = *(uint *)((long)&local_138 + lVar9);
      uVar5 = *(uint *)((long)&local_138 + lVar9 + 4);
      uVar6 = *(uint *)((long)&uStack_130 + lVar9);
      uVar7 = *(uint *)((long)&uStack_130 + lVar9 + 4);
      uVar25 = (uVar4 ^ *(uint *)(local_2b8 + lVar9)) & uVar20;
      uVar26 = (uVar5 ^ *(uint *)(local_2b8 + lVar9 + 4)) & uVar20;
      uVar28 = (uVar6 ^ *(uint *)(local_2b8 + lVar9 + 8)) & uVar20;
      uVar30 = (uVar7 ^ *(uint *)(local_2b8 + lVar9 + 0xc)) & uVar20;
      *(uint *)(local_2b8 + lVar9) = *(uint *)(local_2b8 + lVar9) ^ uVar25;
      *(uint *)(local_2b8 + lVar9 + 4) = *(uint *)(local_2b8 + lVar9 + 4) ^ uVar26;
      *(uint *)(local_2b8 + lVar9 + 8) = *(uint *)(local_2b8 + lVar9 + 8) ^ uVar28;
      *(uint *)(local_2b8 + lVar9 + 0xc) = *(uint *)(local_2b8 + lVar9 + 0xc) ^ uVar30;
      *(uint *)((long)&local_138 + lVar9) = uVar25 ^ uVar4;
      *(uint *)((long)&local_138 + lVar9 + 4) = uVar26 ^ uVar5;
      *(uint *)((long)&uStack_130 + lVar9) = uVar28 ^ uVar6;
      *(uint *)((long)&uStack_130 + lVar9 + 4) = uVar30 ^ uVar7;
      uVar25 = *(uint *)((long)auStack_314 + lVar9 + 4);
      uVar26 = *(uint *)((long)auStack_314 + lVar9 + 8);
      uVar4 = *(uint *)((long)&local_198 + lVar9);
      uVar5 = *(uint *)((long)&local_198 + lVar9 + 4);
      uVar6 = *(uint *)((long)&uStack_190 + lVar9);
      uVar7 = *(uint *)((long)&uStack_190 + lVar9 + 4);
      uVar28 = (uVar4 ^ *(uint *)((long)&local_318 + lVar9)) & uVar20;
      uVar30 = (uVar5 ^ *(uint *)((long)auStack_314 + lVar9)) & uVar20;
      uVar27 = (uVar6 ^ uVar25) & uVar20;
      uVar29 = (uVar7 ^ uVar26) & uVar20;
      *(uint *)((long)&local_318 + lVar9) = *(uint *)((long)&local_318 + lVar9) ^ uVar28;
      *(uint *)((long)auStack_314 + lVar9) = *(uint *)((long)auStack_314 + lVar9) ^ uVar30;
      *(uint *)((long)auStack_314 + lVar9 + 4) = uVar25 ^ uVar27;
      *(uint *)((long)auStack_314 + lVar9 + 8) = uVar26 ^ uVar29;
      *(uint *)((long)&local_198 + lVar9) = uVar28 ^ uVar4;
      *(uint *)((long)&local_198 + lVar9 + 4) = uVar30 ^ uVar5;
      *(uint *)((long)&uStack_190 + lVar9) = uVar27 ^ uVar6;
      *(uint *)((long)&uStack_190 + lVar9 + 4) = uVar29 ^ uVar7;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x60);
    auVar22._0_4_ = auVar22._4_4_;
    auVar22._8_4_ = auVar22._4_4_;
    auVar22._12_4_ = auVar22._4_4_;
    lVar9 = 0;
    do {
      auVar23 = *(undefined1 (*) [16])((long)&local_318 + lVar9) & auVar19;
      auVar24 = (*(undefined1 (*) [16])(local_2b8 + lVar9) ^ auVar22) & auVar23;
      auVar1 = *(undefined1 (*) [16])((long)&local_138 + lVar9);
      auVar31 = *(undefined1 (*) [16])((long)&local_198 + lVar9) ^ auVar23;
      *(undefined1 (*) [16])((long)&local_138 + lVar9) = (auVar31 ^ auVar24) & (auVar23 ^ auVar1);
      *(undefined1 (*) [16])((long)&local_198 + lVar9) = auVar24 ^ auVar1 | auVar31;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x60);
    lVar9 = 0x50;
    uVar18 = 0;
    uVar21 = 0;
    do {
      uVar2 = *(ulong *)((long)&local_138 + lVar9);
      *(ulong *)((long)&local_138 + lVar9) =
           *(ulong *)((long)&uStack_130 + lVar9) << 0x3f | uVar2 >> 1;
      *(ulong *)((long)&uStack_130 + lVar9) = *(ulong *)((long)&uStack_130 + lVar9) >> 1 | uVar21;
      uVar21 = *(ulong *)((long)&local_198 + lVar9);
      *(ulong *)((long)&local_198 + lVar9) =
           *(ulong *)((long)&uStack_190 + lVar9) << 0x3f | uVar21 >> 1;
      *(ulong *)((long)&uStack_190 + lVar9) = *(ulong *)((long)&uStack_190 + lVar9) >> 1 | uVar18;
      lVar9 = lVar9 + -0x10;
      uVar18 = uVar21 << 0x3f;
      uVar21 = uVar2 << 0x3f;
    } while (lVar9 != -0x10);
    lVar9 = 0;
    do {
      uVar4 = *(uint *)(local_1f8 + lVar9);
      uVar5 = *(uint *)(local_1f8 + lVar9 + 4);
      uVar6 = *(uint *)(local_1f8 + lVar9 + 8);
      uVar7 = *(uint *)(local_1f8 + lVar9 + 0xc);
      uVar25 = (uVar4 ^ *(uint *)(local_378 + lVar9)) & uVar20;
      uVar26 = (uVar5 ^ *(uint *)(local_378 + lVar9 + 4)) & uVar20;
      uVar28 = (uVar6 ^ *(uint *)(local_378 + lVar9 + 8)) & uVar20;
      uVar30 = (uVar7 ^ *(uint *)(local_378 + lVar9 + 0xc)) & uVar20;
      *(uint *)(local_378 + lVar9) = *(uint *)(local_378 + lVar9) ^ uVar25;
      *(uint *)(local_378 + lVar9 + 4) = *(uint *)(local_378 + lVar9 + 4) ^ uVar26;
      *(uint *)(local_378 + lVar9 + 8) = *(uint *)(local_378 + lVar9 + 8) ^ uVar28;
      *(uint *)(local_378 + lVar9 + 0xc) = *(uint *)(local_378 + lVar9 + 0xc) ^ uVar30;
      *(uint *)(local_1f8 + lVar9) = uVar25 ^ uVar4;
      *(uint *)(local_1f8 + lVar9 + 4) = uVar26 ^ uVar5;
      *(uint *)(local_1f8 + lVar9 + 8) = uVar28 ^ uVar6;
      *(uint *)(local_1f8 + lVar9 + 0xc) = uVar30 ^ uVar7;
      uVar4 = *(uint *)(local_258 + lVar9);
      uVar5 = *(uint *)(local_258 + lVar9 + 4);
      uVar6 = *(uint *)(local_258 + lVar9 + 8);
      uVar7 = *(uint *)(local_258 + lVar9 + 0xc);
      uVar25 = (uVar4 ^ *(uint *)(local_3d8 + lVar9)) & uVar20;
      uVar26 = (uVar5 ^ *(uint *)(local_3d8 + lVar9 + 4)) & uVar20;
      uVar28 = (uVar6 ^ *(uint *)(local_3d8 + lVar9 + 8)) & uVar20;
      uVar30 = (uVar7 ^ *(uint *)(local_3d8 + lVar9 + 0xc)) & uVar20;
      *(uint *)(local_3d8 + lVar9) = *(uint *)(local_3d8 + lVar9) ^ uVar25;
      *(uint *)(local_3d8 + lVar9 + 4) = *(uint *)(local_3d8 + lVar9 + 4) ^ uVar26;
      *(uint *)(local_3d8 + lVar9 + 8) = *(uint *)(local_3d8 + lVar9 + 8) ^ uVar28;
      *(uint *)(local_3d8 + lVar9 + 0xc) = *(uint *)(local_3d8 + lVar9 + 0xc) ^ uVar30;
      *(uint *)(local_258 + lVar9) = uVar25 ^ uVar4;
      *(uint *)(local_258 + lVar9 + 4) = uVar26 ^ uVar5;
      *(uint *)(local_258 + lVar9 + 8) = uVar28 ^ uVar6;
      *(uint *)(local_258 + lVar9 + 0xc) = uVar30 ^ uVar7;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x60);
    lVar9 = 0;
    do {
      auVar23 = *(undefined1 (*) [16])(local_3d8 + lVar9) & auVar19;
      auVar24 = (*(undefined1 (*) [16])(local_378 + lVar9) ^ auVar22) & auVar23;
      auVar1 = *(undefined1 (*) [16])(local_1f8 + lVar9);
      *(undefined1 (*) [16])(local_1f8 + lVar9) =
           (*(undefined1 (*) [16])(local_258 + lVar9) ^ auVar23 ^ auVar24) & (auVar23 ^ auVar1);
      *(undefined1 (*) [16])(local_258 + lVar9) =
           auVar24 ^ auVar1 | *(undefined1 (*) [16])(local_258 + lVar9) ^ auVar23;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x60);
    uVar10 = ((-uVar10 ^ uVar10) & -(uVar20 & 1) ^ uVar10) + 1;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x577);
  if (uVar10 == 0) {
    pcVar12 = (crypto_word_t *)local_378;
    ppVar13 = out;
    for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
      (ppVar13->s).v[0] = *pcVar12;
      pcVar12 = pcVar12 + (ulong)bVar16 * -2 + 1;
      ppVar13 = (poly3 *)((long)ppVar13 + (ulong)bVar16 * -0x10 + 8);
    }
    ppVar11 = &out->a;
    pcVar12 = (crypto_word_t *)local_3d8;
    ppVar14 = ppVar11;
    for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
      ppVar14->v[0] = *pcVar12;
      pcVar12 = pcVar12 + (ulong)bVar16 * -2 + 1;
      ppVar14 = (poly2 *)((long)ppVar14 + (ulong)bVar16 * -0x10 + 8);
    }
    lVar8 = 0;
    do {
      if (((ushort)local_318 & 1) == 0) {
        cVar15 = 0;
      }
      else {
        cVar15 = (out->a).v[lVar8];
      }
      (out->a).v[lVar8] = cVar15;
      (out->s).v[lVar8] = ((out->s).v[lVar8] ^ -(ulong)((ushort)local_2b8._0_2_ & 1)) & cVar15;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0xb);
    poly2_reverse_700(ppVar11,ppVar11);
    poly2_reverse_700(&out->s,&out->s);
    return;
  }
  __assert_fail("delta == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss.cc"
                ,0x304,"void poly3_invert_vec(struct poly3 *, const struct poly3 *)");
}

Assistant:

void HRSS_poly3_invert(struct poly3 *out, const struct poly3 *in) {
  // The vector version of this function seems slightly slower on AArch64, but
  // is useful on ARMv7 and x86-64.
#if defined(HRSS_HAVE_VECTOR_UNIT) && !defined(OPENSSL_AARCH64)
  if (vec_capable()) {
    poly3_invert_vec(out, in);
    return;
  }
#endif

  // This algorithm is taken from section 7.1 of [SAFEGCD].
  struct poly3 v, r, f, g;
  // v = 0
  poly3_zero(&v);
  // r = 1
  poly3_zero(&r);
  r.a.v[0] = 1;
  // f = all ones.
  OPENSSL_memset(&f.s, 0, sizeof(struct poly2));
  OPENSSL_memset(&f.a, 0xff, sizeof(struct poly2));
  f.a.v[WORDS_PER_POLY - 1] >>= BITS_PER_WORD - BITS_IN_LAST_WORD;
  // g is the reversal of |in|.
  poly3_reverse_700(&g, in);
  int delta = 1;

  for (size_t i = 0; i < (2 * (N - 1)) - 1; i++) {
    poly3_lshift1(&v);

    const crypto_word_t delta_sign_bit = (delta >> (sizeof(delta) * 8 - 1)) & 1;
    const crypto_word_t delta_is_non_negative = delta_sign_bit - 1;
    const crypto_word_t delta_is_non_zero = ~constant_time_is_zero_w(delta);
    const crypto_word_t g_has_constant_term = lsb_to_all(g.a.v[0]);
    const crypto_word_t mask =
        g_has_constant_term & delta_is_non_negative & delta_is_non_zero;

    crypto_word_t c_s, c_a;
    poly3_word_mul(&c_s, &c_a, f.s.v[0], f.a.v[0], g.s.v[0], g.a.v[0]);
    c_s = lsb_to_all(c_s);
    c_a = lsb_to_all(c_a);

    delta = constant_time_select_int(mask, -delta, delta);
    delta++;

    poly3_cswap(&f, &g, mask);
    poly3_fmsub(&g, &f, c_s, c_a);
    poly3_rshift1(&g);

    poly3_cswap(&v, &r, mask);
    poly3_fmsub(&r, &v, c_s, c_a);
  }

  assert(delta == 0);
  poly3_mul_const(&v, f.s.v[0], f.a.v[0]);
  poly3_reverse_700(out, &v);
}